

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# join_order_optimizer.cpp
# Opt level: O3

void __thiscall
duckdb::JoinOrderOptimizer::JoinOrderOptimizer(JoinOrderOptimizer *this,ClientContext *context)

{
  this->context = context;
  QueryGraphManager::QueryGraphManager(&this->query_graph_manager,context);
  (this->filter_infos).
  super_vector<duckdb::unique_ptr<duckdb::FilterInfo,_std::default_delete<duckdb::FilterInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::FilterInfo,_std::default_delete<duckdb::FilterInfo>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::FilterInfo,_std::default_delete<duckdb::FilterInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::FilterInfo,_std::default_delete<duckdb::FilterInfo>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->filter_infos).
  super_vector<duckdb::unique_ptr<duckdb::FilterInfo,_std::default_delete<duckdb::FilterInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::FilterInfo,_std::default_delete<duckdb::FilterInfo>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::FilterInfo,_std::default_delete<duckdb::FilterInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::FilterInfo,_std::default_delete<duckdb::FilterInfo>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->filters).
  super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->filter_infos).
  super_vector<duckdb::unique_ptr<duckdb::FilterInfo,_std::default_delete<duckdb::FilterInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::FilterInfo,_std::default_delete<duckdb::FilterInfo>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::FilterInfo,_std::default_delete<duckdb::FilterInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::FilterInfo,_std::default_delete<duckdb::FilterInfo>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->filters).
  super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->filters).
  super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->equivalence_sets)._M_h._M_buckets = &(this->equivalence_sets)._M_h._M_single_bucket;
  (this->equivalence_sets)._M_h._M_bucket_count = 1;
  (this->equivalence_sets)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->equivalence_sets)._M_h._M_element_count = 0;
  (this->equivalence_sets)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->equivalence_sets)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->equivalence_sets)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->cardinality_estimator).relations_to_tdoms.
  super_vector<duckdb::RelationsToTDom,_std::allocator<duckdb::RelationsToTDom>_>.
  super__Vector_base<duckdb::RelationsToTDom,_std::allocator<duckdb::RelationsToTDom>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->cardinality_estimator).relations_to_tdoms.
  super_vector<duckdb::RelationsToTDom,_std::allocator<duckdb::RelationsToTDom>_>.
  super__Vector_base<duckdb::RelationsToTDom,_std::allocator<duckdb::RelationsToTDom>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->cardinality_estimator).relations_to_tdoms.
  super_vector<duckdb::RelationsToTDom,_std::allocator<duckdb::RelationsToTDom>_>.
  super__Vector_base<duckdb::RelationsToTDom,_std::allocator<duckdb::RelationsToTDom>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->cardinality_estimator).relation_set_2_cardinality._M_h._M_buckets =
       &(this->cardinality_estimator).relation_set_2_cardinality._M_h._M_single_bucket;
  (this->cardinality_estimator).relation_set_2_cardinality._M_h._M_bucket_count = 1;
  (this->cardinality_estimator).relation_set_2_cardinality._M_h._M_before_begin._M_nxt =
       (_Hash_node_base *)0x0;
  (this->cardinality_estimator).relation_set_2_cardinality._M_h._M_element_count = 0;
  (this->cardinality_estimator).relation_set_2_cardinality._M_h._M_rehash_policy._M_max_load_factor
       = 1.0;
  (this->cardinality_estimator).relation_set_2_cardinality._M_h._M_rehash_policy._M_next_resize = 0;
  (this->cardinality_estimator).relation_set_2_cardinality._M_h._M_single_bucket =
       (__node_base_ptr)0x0;
  (this->cardinality_estimator).set_manager.root.relation.
  super_unique_ptr<duckdb::JoinRelationSet,_std::default_delete<duckdb::JoinRelationSet>_>._M_t.
  super___uniq_ptr_impl<duckdb::JoinRelationSet,_std::default_delete<duckdb::JoinRelationSet>_>._M_t
  .super__Tuple_impl<0UL,_duckdb::JoinRelationSet_*,_std::default_delete<duckdb::JoinRelationSet>_>
       = (_Tuple_impl<0UL,_duckdb::JoinRelationSet_*,_std::default_delete<duckdb::JoinRelationSet>_>
         )0x0;
  (this->cardinality_estimator).set_manager.root.children._M_h._M_buckets =
       &(this->cardinality_estimator).set_manager.root.children._M_h._M_single_bucket;
  (this->cardinality_estimator).set_manager.root.children._M_h._M_bucket_count = 1;
  (this->cardinality_estimator).set_manager.root.children._M_h._M_before_begin._M_nxt =
       (_Hash_node_base *)0x0;
  (this->cardinality_estimator).set_manager.root.children._M_h._M_element_count = 0;
  (this->cardinality_estimator).set_manager.root.children._M_h._M_rehash_policy._M_max_load_factor =
       1.0;
  (this->cardinality_estimator).relation_stats.
  super_vector<duckdb::RelationStats,_std::allocator<duckdb::RelationStats>_>.
  super__Vector_base<duckdb::RelationStats,_std::allocator<duckdb::RelationStats>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->cardinality_estimator).relation_stats.
  super_vector<duckdb::RelationStats,_std::allocator<duckdb::RelationStats>_>.
  super__Vector_base<duckdb::RelationStats,_std::allocator<duckdb::RelationStats>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->cardinality_estimator).relation_stats.
  super_vector<duckdb::RelationStats,_std::allocator<duckdb::RelationStats>_>.
  super__Vector_base<duckdb::RelationStats,_std::allocator<duckdb::RelationStats>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->cardinality_estimator).set_manager.root.children._M_h._M_rehash_policy._M_next_resize = 0;
  (this->cardinality_estimator).set_manager.root.children._M_h._M_single_bucket =
       (__node_base_ptr)0x0;
  (this->join_nodes_in_full_plan)._M_h._M_buckets =
       &(this->join_nodes_in_full_plan)._M_h._M_single_bucket;
  (this->join_nodes_in_full_plan)._M_h._M_bucket_count = 1;
  (this->join_nodes_in_full_plan)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->join_nodes_in_full_plan)._M_h._M_element_count = 0;
  (this->join_nodes_in_full_plan)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->join_nodes_in_full_plan)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->join_nodes_in_full_plan)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->materialized_cte_stats)._M_h._M_buckets =
       &(this->materialized_cte_stats)._M_h._M_single_bucket;
  (this->materialized_cte_stats)._M_h._M_bucket_count = 1;
  (this->materialized_cte_stats)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->materialized_cte_stats)._M_h._M_element_count = 0;
  (this->materialized_cte_stats)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->materialized_cte_stats)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->materialized_cte_stats)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->delim_scan_stats).ptr = (RelationStats *)0x0;
  return;
}

Assistant:

JoinOrderOptimizer::JoinOrderOptimizer(ClientContext &context) : context(context), query_graph_manager(context) {
}